

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O0

void beltBin2StrSub(word mod,u16 *str,size_t count,octet *bin,size_t b)

{
  ulong uVar1;
  word wVar2;
  word *in_RCX;
  word *pwVar3;
  word *in_RDX;
  word *in_RSI;
  ulong in_RDI;
  size_t in_R8;
  u16 *uu;
  size_t m;
  word *a;
  u32 t;
  void *in_stack_ffffffffffffffb8;
  u16 *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  if (in_RDI == 0x10000) {
    u16From(in_stack_ffffffffffffffc0,in_RCX,0x14a178);
    while (pwVar3 = (word *)((long)in_RDX + -1), in_RDX != (word *)0x0) {
      *(ushort *)((long)in_RSI + (long)pwVar3 * 2) =
           *(ushort *)((long)in_RSI + (long)pwVar3 * 2) -
           *(short *)((long)in_RCX + (long)pwVar3 * 2);
      in_RDX = pwVar3;
    }
  }
  else {
    u64From((u64 *)(in_R8 * 8 + 7 >> 3),in_stack_ffffffffffffffb8,0x14a1f3);
    while (pwVar3 = (word *)((long)in_RDX + -1), in_RDX != (word *)0x0) {
      wVar2 = zzModW(in_RCX,in_R8,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      uVar1 = (ulong)(((uint)(ushort)*in_RSI + (int)in_RDI) - (int)wVar2) % in_RDI;
      in_stack_ffffffffffffffd4 = (undefined4)uVar1;
      *(ushort *)in_RSI = (ushort)uVar1;
      in_RSI = (word *)((long)in_RSI + 2);
      zzDivW(in_RSI,pwVar3,(size_t)in_RCX,in_R8);
      in_RDX = pwVar3;
    }
  }
  return;
}

Assistant:

static void beltBin2StrSub(word mod, u16 str[], size_t count, 
	octet bin[], size_t b)
{
	register u32 t;
	word* a;
	size_t m;
	// особый случай: mod может не уложиться в word
	if (mod == 65536)
	{
		u16* uu = (u16*)bin;
		u16From(uu, bin, 8 * b);
		while (count--)
			str[count] -= uu[count];
		return;
	}
	// настроить память
	m = W_OF_O(8 * b);
	a = (word*)bin;
	wwFrom(a, bin, 8 * b);
	// конвертировать и вычесть
	ASSERT(2 <= mod && mod <= 65536);
	while (count--)
	{
		t = (u32)zzModW(a, m, mod);
		t = str[0] + mod - t, t %= mod;
		str[0] = (u16)t, ++str;
		zzDivW(a, a, m, mod);
	}
	t = 0;
}